

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O1

Literal * wasm::Properties::getLiteral(Literal *__return_storage_ptr__,Expression *curr)

{
  Id IVar1;
  uint uVar2;
  uintptr_t uVar3;
  int *piVar4;
  Expression func;
  HeapType type;
  string local_58;
  anon_union_16_5_9943fe1e_for_Literal_0 local_38;
  
  IVar1 = curr->_id;
  if ((int)IVar1 < 0x36) {
    if (IVar1 == ConstId) {
      Literal::Literal(__return_storage_ptr__,(Literal *)(curr + 1));
    }
    else if (IVar1 == RefNullId) {
      Literal::Literal(__return_storage_ptr__,(Type)(curr->type).id);
    }
    else {
      if (IVar1 != RefFuncId) goto LAB_00625177;
      func = curr[1];
      type = wasm::Type::getHeapType(&curr->type);
      Literal::Literal(__return_storage_ptr__,(Name)func,type);
    }
  }
  else if (IVar1 == I31NewId) {
    piVar4 = *(int **)(curr + 1);
    if (*piVar4 != 0xe) {
LAB_00625177:
      handle_unreachable("non-constant expression",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/properties.h"
                         ,0x85);
    }
    if (*(long *)(piVar4 + 8) != 2) {
      __assert_fail("type == Type::i32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                    ,0x118,"int32_t wasm::Literal::geti32() const");
    }
    uVar2 = piVar4[4];
    wasm::Type::Type((Type *)&local_38.func,(HeapType)0x4,NonNullable);
    Literal::Literal(__return_storage_ptr__,(Type)local_38.i64);
    (__return_storage_ptr__->field_0).i32 = uVar2 | 0x80000000;
  }
  else if (IVar1 == RefAsId) {
    if (curr[1]._id == BlockId) {
      getLiteral((Literal *)&local_38.func,(Expression *)curr[1].type.id);
      Literal::internalize(__return_storage_ptr__,(Literal *)&local_38.func);
    }
    else {
      if (curr[1]._id != IfId) goto LAB_00625177;
      getLiteral((Literal *)&local_38.func,(Expression *)curr[1].type.id);
      Literal::externalize(__return_storage_ptr__,(Literal *)&local_38.func);
    }
    Literal::~Literal((Literal *)&local_38.func);
  }
  else {
    if (IVar1 != StringConstId) goto LAB_00625177;
    uVar3 = curr[1].type.id;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,uVar3,*(long *)(curr + 1) + uVar3);
    Literal::Literal(__return_storage_ptr__,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline Literal getLiteral(const Expression* curr) {
  if (auto* c = curr->dynCast<Const>()) {
    return c->value;
  } else if (auto* n = curr->dynCast<RefNull>()) {
    return Literal(n->type);
  } else if (auto* r = curr->dynCast<RefFunc>()) {
    return Literal(r->func, r->type.getHeapType());
  } else if (auto* i = curr->dynCast<I31New>()) {
    if (auto* c = i->value->dynCast<Const>()) {
      return Literal::makeI31(c->value.geti32());
    }
  } else if (auto* s = curr->dynCast<StringConst>()) {
    return Literal(s->string.toString());
  } else if (auto* r = curr->dynCast<RefAs>()) {
    if (r->op == ExternExternalize) {
      return getLiteral(r->value).externalize();
    } else if (r->op == ExternInternalize) {
      return getLiteral(r->value).internalize();
    }
  }
  WASM_UNREACHABLE("non-constant expression");
}